

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-writer.c
# Opt level: O2

void labpack_writer_end(labpack_writer_t *writer)

{
  mpack_error_t mVar1;
  char *pcVar2;
  
  if (writer != (labpack_writer_t *)0x0) {
    mVar1 = mpack_writer_destroy(writer->encoder);
    if (mVar1 != mpack_ok) {
      writer->status = LABPACK_STATUS_ERROR_ENCODER;
      pcVar2 = mpack_error_to_string(writer->encoder->error);
      writer->status_message = pcVar2;
    }
    return;
  }
  __assert_fail("writer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-writer.c"
                ,0x7d,"void labpack_writer_end(labpack_writer_t *)");
}

Assistant:

void
labpack_writer_end(labpack_writer_t* writer)
{
    assert(writer);
    if (mpack_writer_destroy(writer->encoder) != mpack_ok) {
        writer->status = LABPACK_STATUS_ERROR_ENCODER;
        writer->status_message = mpack_error_to_string(mpack_writer_error(writer->encoder));
    }
}